

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Resize(Mat *this,int newn,int newm)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  Mat ytemp;
  Mat local_28;
  
  Mat(&local_28,this);
  if ((this->n_cols_ != newn) || (this->n_rows_ != newm)) {
    if (this->v_ != (double *)0x0) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = newn;
    this->n_cols_ = newm;
    if (newm * newn < 1) {
      pdVar2 = (double *)0x0;
    }
    else {
      pdVar2 = (double *)operator_new__((ulong)(uint)(newm * newn) << 3);
    }
    this->v_ = pdVar2;
    if (newn <= local_28.n_rows_) {
      local_28.n_rows_ = this->n_rows_;
    }
    if (0 < local_28.n_rows_) {
      uVar1 = this->n_cols_;
      if (local_28.n_cols_ < newm) {
        uVar1 = local_28.n_cols_;
      }
      uVar4 = 0;
      pdVar3 = local_28.v_;
      do {
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            pdVar2[uVar5] = pdVar3[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + local_28.n_cols_;
        pdVar2 = pdVar2 + newm;
      } while (uVar4 != (uint)local_28.n_rows_);
    }
  }
  if (local_28.v_ != (double *)0x0) {
    operator_delete__(local_28.v_);
    return;
  }
  return;
}

Assistant:

void Mat::Resize(int newn, int newm)
{
	int i,nel;
	Mat ytemp = (*this);

	if (newn != n_cols_ || newm != n_rows_) {
		if (v_ != NULL) 
			delete[] (v_);		
		n_rows_ = newn;
		n_cols_ = newm;
		int nEl = n_rows_*n_cols_;
		v_ = n_rows_*n_cols_>0 ? new double[nEl] : NULL;		
		for (int i = 0; i < min(n_rows_,ytemp.n_rows_) ; i++)
			for (int j = 0; j < min(n_cols_,ytemp.n_cols_) ; j++)
				v_[i*n_cols_+j] = ytemp.v_[i*ytemp.n_cols_+j];
	}
}